

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a1.cpp
# Opt level: O2

void __thiscall RasterizerA1::_renderImpl<CompositorScalar,true>(RasterizerA1 *this,uint32_t argb32)

{
  int iVar1;
  uint uVar2;
  Image *pIVar3;
  long lVar4;
  Cell *pCVar5;
  uint32_t bPix;
  uint32_t uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint32_t *dstPix;
  uint8_t *puVar13;
  long lVar14;
  
  iVar1 = (this->super_CellRasterizer).super_Rasterizer._width;
  uVar2 = (this->super_CellRasterizer).super_Rasterizer._height;
  pIVar3 = (this->super_CellRasterizer).super_Rasterizer._dst;
  lVar4 = pIVar3->_stride;
  puVar13 = pIVar3->_data;
  bPix = PixelUtils::premultiply(argb32);
  uVar10 = 0;
  uVar11 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar11 = uVar10;
  }
  for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
    pCVar5 = this->_cells;
    lVar9 = this->_cellStride * uVar10;
    iVar12 = 0;
    for (lVar14 = 0; iVar1 != lVar14; lVar14 = lVar14 + 1) {
      iVar12 = iVar12 + *(int32_t *)((long)&pCVar5[lVar14].cover + lVar9);
      uVar8 = iVar12 - (*(int32_t *)((long)&pCVar5[lVar14].area + lVar9) >> 9);
      uVar2 = -uVar8;
      if (0 < (int)uVar8) {
        uVar2 = uVar8;
      }
      *(undefined8 *)((long)&pCVar5[lVar14].cover + lVar9) = 0;
      uVar6 = bPix;
      if (uVar2 < 0xff) {
        uVar6 = PixelUtils::src(*(uint32_t *)(puVar13 + lVar14 * 4),bPix,uVar2);
      }
      *(uint32_t *)(puVar13 + lVar14 * 4) = uVar6;
    }
    puVar13 = puVar13 + lVar4;
    uVar10 = uVar10 + 8;
  }
  return;
}

Assistant:

inline void RasterizerA1::_renderImpl(uint32_t argb32) noexcept {
  int w = _width;
  int h = _height;

  uint8_t* dstLine = _dst->data();
  intptr_t stride = _dst->stride();

  Compositor compositor(argb32);
  for (int y = 0; y < h; y++, dstLine += stride) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y * _cellStride];

    size_t x0 = 0;
    int cover = 0;
    compositor.template vmask<NonZero>(dstPix, x0, w, cell, cover);
  }
}